

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_tlbre_40x(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_ptr pTVar2;
  long lVar3;
  uint32_t error;
  uint32_t excp;
  code *func;
  TCGTemp *local_18;
  long local_10;
  
  if (ctx->pr == true) {
    excp = 6;
    error = 0x31;
LAB_00b8c512:
    gen_exception_err(ctx,excp,error);
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  if ((short)((uVar1 & 0xffff) >> 0xb) == 1) {
    pTVar2 = tcg_ctx->cpu_env;
    local_10 = *(long *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8));
    lVar3 = *(long *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8));
    func = helper_4xx_tlbre_lo_ppc64;
  }
  else {
    if ((uVar1 & 0xffff) >> 0xb != 0) {
      excp = 0x60;
      error = 0x21;
      goto LAB_00b8c512;
    }
    pTVar2 = tcg_ctx->cpu_env;
    local_10 = *(long *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8));
    lVar3 = *(long *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8));
    func = helper_4xx_tlbre_hi_ppc64;
  }
  local_10 = (long)&tcg_ctx->pool_cur + local_10;
  local_18 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
  tcg_gen_callN_ppc64(tcg_ctx,func,(TCGTemp *)((long)&tcg_ctx->pool_cur + lVar3),2,&local_18);
  return;
}

Assistant:

static void gen_tlbre_40x(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    CHK_SV;
    switch (rB(ctx->opcode)) {
    case 0:
        gen_helper_4xx_tlbre_hi(tcg_ctx, cpu_gpr[rD(ctx->opcode)], tcg_ctx->cpu_env,
                                cpu_gpr[rA(ctx->opcode)]);
        break;
    case 1:
        gen_helper_4xx_tlbre_lo(tcg_ctx, cpu_gpr[rD(ctx->opcode)], tcg_ctx->cpu_env,
                                cpu_gpr[rA(ctx->opcode)]);
        break;
    default:
        gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
        break;
    }
}